

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

char * __thiscall
tinyxml2::StrPair::ParseText(StrPair *this,char *p,char *endTag,int strFlags,int *curLineNumPtr)

{
  char cVar1;
  int iVar2;
  size_t __n;
  size_t length;
  char endChar;
  char *start;
  int *curLineNumPtr_local;
  int strFlags_local;
  char *endTag_local;
  char *p_local;
  StrPair *this_local;
  
  cVar1 = *endTag;
  __n = strlen(endTag);
  endTag_local = p;
  while( true ) {
    if (*endTag_local == '\0') {
      return (char *)0x0;
    }
    if ((*endTag_local == cVar1) && (iVar2 = strncmp(endTag_local,endTag,__n), iVar2 == 0)) break;
    if (*endTag_local == '\n') {
      *curLineNumPtr = *curLineNumPtr + 1;
    }
    endTag_local = endTag_local + 1;
  }
  Set(this,p,endTag_local,strFlags);
  return endTag_local + __n;
}

Assistant:

char* StrPair::ParseText( char* p, const char* endTag, int strFlags, int* curLineNumPtr )
{
    TIXMLASSERT( p );
    TIXMLASSERT( endTag && *endTag );
	TIXMLASSERT(curLineNumPtr);

    char* start = p;
    const char  endChar = *endTag;
    size_t length = strlen( endTag );

    // Inner loop of text parsing.
    while ( *p ) {
        if ( *p == endChar && strncmp( p, endTag, length ) == 0 ) {
            Set( start, p, strFlags );
            return p + length;
        } else if (*p == '\n') {
            ++(*curLineNumPtr);
        }
        ++p;
        TIXMLASSERT( p );
    }
    return 0;
}